

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingUtils.h
# Opt level: O3

bool __thiscall Assimp::AC3DImporter::GetNextLine(AC3DImporter *this)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  
  pbVar3 = (byte *)this->buffer;
  while( true ) {
    bVar2 = *pbVar3;
    if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) break;
    pbVar3 = pbVar3 + 1;
  }
  while ((bVar2 == 0xd || (bVar2 == 10))) {
    pbVar1 = pbVar3 + 1;
    pbVar3 = pbVar3 + 1;
    bVar2 = *pbVar1;
  }
  this->buffer = (char *)pbVar3;
  for (; (*pbVar3 == 0x20 || (*pbVar3 == 9)); pbVar3 = pbVar3 + 1) {
  }
  this->buffer = (char *)pbVar3;
  return (bool)((byte)(0xbfe >> (*pbVar3 & 0x1f)) & 1 | 0xd < *pbVar3);
}

Assistant:

AI_FORCE_INLINE
bool SkipLine( const char_t** inout) {
    return SkipLine<char_t>(*inout,inout);
}